

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_writer.cc
# Opt level: O3

bool __thiscall google::protobuf::compiler::ZipWriter::WriteDirectory(ZipWriter *this)

{
  uint16_t val;
  int iVar1;
  int iVar2;
  pointer pFVar3;
  void *data;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  int64_t iVar6;
  int *piVar7;
  long lVar8;
  size_t __n;
  CodedOutputStream output;
  CodedOutputStream local_a0;
  undefined8 local_50;
  long local_48;
  long local_40;
  ZipWriter *local_38;
  
  lVar8 = ((long)(this->files_).
                 super__Vector_base<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->files_).
                 super__Vector_base<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
  iVar5 = (*this->raw_output_->_vptr_ZeroCopyOutputStream[4])();
  local_50 = CONCAT44(extraout_var,iVar5);
  local_38 = this;
  io::CodedOutputStream::CodedOutputStream(&local_a0,this->raw_output_,true);
  local_48 = lVar8;
  if ((short)lVar8 != 0) {
    local_40 = (ulong)(((uint)lVar8 & 0xffff) << 4) * 3;
    lVar8 = 0;
    do {
      pFVar3 = (local_38->files_).
               super__Vector_base<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      val = *(uint16_t *)((long)&(pFVar3->name)._M_string_length + lVar8);
      iVar5 = *(int *)((long)&pFVar3->crc32 + lVar8);
      iVar1 = *(int *)((long)&pFVar3->size + lVar8);
      iVar2 = *(int *)((long)&pFVar3->offset + lVar8);
      if (local_a0.impl_.end_ <= local_a0.cur_) {
        local_a0.cur_ = io::EpsCopyOutputStream::EnsureSpaceFallback(&local_a0.impl_,local_a0.cur_);
      }
      *(int *)local_a0.cur_ = 0x2014b50;
      local_a0.cur_ = (uint8_t *)((long)local_a0.cur_ + 4);
      WriteShort(&local_a0,10);
      WriteShort(&local_a0,10);
      WriteShort(&local_a0,0);
      WriteShort(&local_a0,0);
      WriteShort(&local_a0,0);
      WriteShort(&local_a0,0x21);
      if (local_a0.impl_.end_ <= local_a0.cur_) {
        local_a0.cur_ = io::EpsCopyOutputStream::EnsureSpaceFallback(&local_a0.impl_,local_a0.cur_);
      }
      *(int *)local_a0.cur_ = iVar5;
      piVar7 = (int *)((long)local_a0.cur_ + 4);
      if (local_a0.impl_.end_ <= piVar7) {
        local_a0.cur_ = (uint8_t *)piVar7;
        piVar7 = (int *)io::EpsCopyOutputStream::EnsureSpaceFallback
                                  (&local_a0.impl_,(uint8_t *)piVar7);
      }
      *piVar7 = iVar1;
      piVar7 = piVar7 + 1;
      if (local_a0.impl_.end_ <= piVar7) {
        local_a0.cur_ = (uint8_t *)piVar7;
        piVar7 = (int *)io::EpsCopyOutputStream::EnsureSpaceFallback
                                  (&local_a0.impl_,(uint8_t *)piVar7);
      }
      *piVar7 = iVar1;
      local_a0.cur_ = (uint8_t *)(piVar7 + 1);
      WriteShort(&local_a0,val);
      WriteShort(&local_a0,0);
      WriteShort(&local_a0,0);
      WriteShort(&local_a0,0);
      WriteShort(&local_a0,0);
      if (local_a0.impl_.end_ <= local_a0.cur_) {
        local_a0.cur_ = io::EpsCopyOutputStream::EnsureSpaceFallback(&local_a0.impl_,local_a0.cur_);
      }
      *(int *)local_a0.cur_ = 0;
      piVar7 = (int *)((long)local_a0.cur_ + 4);
      if (local_a0.impl_.end_ <= piVar7) {
        local_a0.cur_ = (uint8_t *)piVar7;
        piVar7 = (int *)io::EpsCopyOutputStream::EnsureSpaceFallback
                                  (&local_a0.impl_,(uint8_t *)piVar7);
      }
      *piVar7 = iVar2;
      piVar7 = piVar7 + 1;
      data = *(void **)((long)&(pFVar3->name)._M_dataplus._M_p + lVar8);
      iVar5 = (int)*(undefined8 *)((long)&(pFVar3->name)._M_string_length + lVar8);
      __n = (size_t)iVar5;
      local_a0.cur_ = (uint8_t *)piVar7;
      if ((long)local_a0.impl_.end_ - (long)piVar7 < (long)__n) {
        local_a0.cur_ =
             io::EpsCopyOutputStream::WriteRawFallback(&local_a0.impl_,data,iVar5,(uint8_t *)piVar7)
        ;
      }
      else {
        memcpy(piVar7,data,__n);
        local_a0.cur_ = (uint8_t *)((long)piVar7 + __n);
      }
      lVar8 = lVar8 + 0x30;
    } while (local_40 != lVar8);
  }
  iVar6 = io::EpsCopyOutputStream::ByteCount(&local_a0.impl_,local_a0.cur_);
  lVar8 = local_48;
  if (local_a0.impl_.end_ <= local_a0.cur_) {
    local_a0.cur_ = io::EpsCopyOutputStream::EnsureSpaceFallback(&local_a0.impl_,local_a0.cur_);
  }
  *(int *)local_a0.cur_ = 0x6054b50;
  local_a0.cur_ = (uint8_t *)((long)local_a0.cur_ + 4);
  WriteShort(&local_a0,0);
  WriteShort(&local_a0,0);
  WriteShort(&local_a0,(uint16_t)lVar8);
  WriteShort(&local_a0,(uint16_t)lVar8);
  if (local_a0.impl_.end_ <= local_a0.cur_) {
    local_a0.cur_ = io::EpsCopyOutputStream::EnsureSpaceFallback(&local_a0.impl_,local_a0.cur_);
  }
  *(int *)local_a0.cur_ = (int)iVar6 - (int)local_a0.start_count_;
  piVar7 = (int *)((long)local_a0.cur_ + 4);
  if (local_a0.impl_.end_ <= piVar7) {
    local_a0.cur_ = (uint8_t *)piVar7;
    piVar7 = (int *)io::EpsCopyOutputStream::EnsureSpaceFallback(&local_a0.impl_,(uint8_t *)piVar7);
  }
  *piVar7 = (int)local_50;
  local_a0.cur_ = (uint8_t *)(piVar7 + 1);
  WriteShort(&local_a0,0);
  bVar4 = io::CodedOutputStream::HadError(&local_a0);
  io::CodedOutputStream::~CodedOutputStream(&local_a0);
  return bVar4;
}

Assistant:

bool ZipWriter::WriteDirectory() {
  uint16_t num_entries = files_.size();
  uint32_t dir_ofs = raw_output_->ByteCount();

  // write central directory
  io::CodedOutputStream output(raw_output_);
  for (int i = 0; i < num_entries; ++i) {
    const std::string& filename = files_[i].name;
    uint16_t filename_size = filename.size();
    uint32_t crc32 = files_[i].crc32;
    uint32_t size = files_[i].size;
    uint32_t offset = files_[i].offset;

    output.WriteLittleEndian32(0x02014b50);  // magic
    WriteShort(&output, 10);                 // version made by
    WriteShort(&output, 10);                 // version needed to extract
    WriteShort(&output, 0);                  // flags
    WriteShort(&output, 0);                  // compression method: stored
    WriteShort(&output, 0);                  // last modified time
    WriteShort(&output, kDosEpoch);          // last modified date
    output.WriteLittleEndian32(crc32);       // crc-32
    output.WriteLittleEndian32(size);        // compressed size
    output.WriteLittleEndian32(size);        // uncompressed size
    WriteShort(&output, filename_size);      // file name length
    WriteShort(&output, 0);                  // extra field length
    WriteShort(&output, 0);                  // file comment length
    WriteShort(&output, 0);                  // starting disk number
    WriteShort(&output, 0);                  // internal file attributes
    output.WriteLittleEndian32(0);           // external file attributes
    output.WriteLittleEndian32(offset);      // local header offset
    output.WriteString(filename);            // file name
  }
  uint32_t dir_len = output.ByteCount();

  // write end of central directory marker
  output.WriteLittleEndian32(0x06054b50);  // magic
  WriteShort(&output, 0);                  // disk number
  WriteShort(&output, 0);               // disk with start of central directory
  WriteShort(&output, num_entries);     // central directory entries (this disk)
  WriteShort(&output, num_entries);     // central directory entries (total)
  output.WriteLittleEndian32(dir_len);  // central directory byte size
  output.WriteLittleEndian32(dir_ofs);  // central directory offset
  WriteShort(&output, 0);               // comment length

  return output.HadError();
}